

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O1

void __thiscall Liby::PollerSelect::removeChanel(PollerSelect *this,Channel *ch)

{
  __fd_mask *p_Var1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Logger *this_00;
  uint uVar6;
  uint uVar7;
  int iVar8;
  double __x;
  
  if (ch != (Channel *)0x0) {
    uVar4 = ch->fd_;
    if (-1 < (int)uVar4) {
      bVar2 = (byte)uVar4 & 0x3f;
      uVar5 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
      uVar6 = uVar4 >> 6;
      p_Var1 = (this->rset_).fds_bits + uVar6;
      *p_Var1 = *p_Var1 & uVar5;
      p_Var1 = (this->wset_).fds_bits + uVar6;
      *p_Var1 = *p_Var1 & uVar5;
      p_Var1 = (this->eset_).fds_bits + uVar6;
      *p_Var1 = *p_Var1 & uVar5;
      this_00 = Logger::getLogger();
      Logger::log(this_00,__x);
      (this->super_Poller).channels_.
      super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = (Channel *)0x0;
      if (uVar4 == this->maxfd_) {
        uVar4 = this->maxfd_;
        uVar6 = uVar4;
        while( true ) {
          uVar3 = uVar6 - 1;
          if (uVar3 == 0) break;
          uVar6 = uVar6 + 0x3e;
          if (-1 < (int)uVar3) {
            uVar6 = uVar3;
          }
          iVar8 = (int)uVar6 >> 6;
          uVar5 = 1L << ((byte)uVar3 & 0x3f);
          uVar7 = uVar3;
          if (((((ulong)(this->rset_).fds_bits[iVar8] >> ((ulong)uVar3 & 0x3f) & 1) != 0) ||
              (uVar4 = uVar4 - 1, uVar7 = uVar4, ((this->wset_).fds_bits[iVar8] & uVar5) != 0)) ||
             (uVar6 = uVar3, ((this->eset_).fds_bits[iVar8] & uVar5) != 0)) goto LAB_00117db5;
        }
        uVar7 = 0;
LAB_00117db5:
        this->maxfd_ = uVar7;
      }
      return;
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                ,0x30,"virtual void Liby::PollerSelect::removeChanel(Channel *)");
}

Assistant:

void PollerSelect::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    FD_CLR(fd, &rset_);
    FD_CLR(fd, &wset_);
    FD_CLR(fd, &eset_);

    verbose("try to remove fd %d channel %p", fd, ch);

    setChannel(fd, nullptr);

    if (fd == maxfd_) {
        while (--maxfd_) {
            if (FD_ISSET(maxfd_, &rset_) || FD_ISSET(maxfd_, &wset_) ||
                FD_ISSET(maxfd_, &eset_)) {
                break;
            }
        }
    }
}